

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void nn_print_requires(nn_parse_context *ctx,unsigned_long mask)

{
  nn_option *pnVar1;
  nn_option *opt;
  int i;
  unsigned_long mask_local;
  nn_parse_context *ctx_local;
  
  opt._4_4_ = 0;
  while (pnVar1 = ctx->options + opt._4_4_, pnVar1->longname != (char *)0x0) {
    if (((pnVar1->mask_set & mask) != 0) &&
       (fprintf(_stderr,"    --%s\n",pnVar1->longname), pnVar1->shortname != '\0')) {
      fprintf(_stderr,"    -%c\n",(ulong)(uint)(int)pnVar1->shortname);
    }
    opt._4_4_ = opt._4_4_ + 1;
  }
  exit(1);
}

Assistant:

static void nn_print_requires (struct nn_parse_context *ctx, unsigned long mask)
{
    int i;
    struct nn_option *opt;

    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (opt->mask_set & mask) {
            fprintf (stderr, "    --%s\n", opt->longname);
            if (opt->shortname) {
                fprintf (stderr, "    -%c\n", opt->shortname);
            }
        }
    }
    exit (1);
}